

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_range_compression.cc
# Opt level: O2

bool __thiscall
sptk::DynamicRangeCompression::Run
          (DynamicRangeCompression *this,double input,double *output,Buffer *buffer)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  if (buffer == (Buffer *)0x0) {
    return false;
  }
  if (output == (double *)0x0) {
    return false;
  }
  if (this->is_valid_ == false) {
    return false;
  }
  dVar1 = FloorLog10(ABS(input / this->abs_max_value_));
  dVar1 = dVar1 * 20.0;
  dVar3 = this->threshold_;
  dVar4 = this->knee_width_;
  dVar5 = dVar4 * -0.5 + dVar3;
  dVar2 = dVar1;
  if (dVar5 < dVar1) {
    if (dVar4 + dVar5 <= dVar1) {
      dVar2 = (dVar1 - dVar3) / this->ratio_ + dVar3;
    }
    else {
      dVar2 = ((1.0 / this->ratio_ + -1.0) * (dVar1 - dVar5) * (dVar1 - dVar5)) / (dVar4 + dVar4) +
              dVar1;
    }
  }
  if (kDecoupledSmooth < this->detector_type_) {
    return false;
  }
  dVar1 = dVar1 - dVar2;
  switch(this->detector_type_) {
  case kBranching:
    dVar4 = buffer->prev_yl;
    if (dVar1 <= dVar4) {
      dVar4 = dVar4 * this->alpha_r_;
      goto LAB_00103eff;
    }
LAB_00103e58:
    dVar3 = this->alpha_a_;
    break;
  case kDecoupled:
    dVar3 = this->alpha_r_ * buffer->prev_y1;
    if (dVar3 <= dVar1) {
      dVar3 = dVar1;
    }
    dVar4 = this->alpha_a_ * buffer->prev_yl + (1.0 - this->alpha_a_) * dVar3;
    goto LAB_00103ed5;
  case kBranchingSmooth:
    dVar4 = buffer->prev_yl;
    if (dVar4 < dVar1) goto LAB_00103e58;
    dVar3 = this->alpha_r_;
    break;
  case kDecoupledSmooth:
    dVar3 = this->alpha_r_ * buffer->prev_y1 + (1.0 - this->alpha_r_) * dVar1;
    if (dVar3 <= dVar1) {
      dVar3 = dVar1;
    }
    dVar4 = this->alpha_a_ * buffer->prev_yl + (1.0 - this->alpha_a_) * dVar3;
LAB_00103ed5:
    buffer->prev_y1 = dVar3;
    goto LAB_00103eff;
  }
  dVar4 = dVar4 * dVar3 + dVar1 * (1.0 - dVar3);
LAB_00103eff:
  buffer->prev_yl = dVar4;
  dVar3 = pow(10.0,(this->makeup_gain_ - dVar4) * 0.05);
  *output = dVar3 * input;
  return true;
}

Assistant:

bool DynamicRangeCompression::Run(
    const double input, double* output,
    DynamicRangeCompression::Buffer* buffer) const {
  // Check inputs.
  if (!is_valid_ || NULL == output || NULL == buffer) {
    return false;
  }

  // Convert to decibels.
  const double xg(20.0 * sptk::FloorLog10(std::fabs(input / abs_max_value_)));

  // Gain computer.
  double yg;
  {
    const double t1(threshold_ - 0.5 * knee_width_);
    const double t2(t1 + knee_width_);
    if (xg <= t1) {
      yg = xg;
    } else if (t2 <= xg) {
      yg = threshold_ + (xg - threshold_) / ratio_;
    } else {
      const double x(xg - t1);
      yg = xg + (1.0 / ratio_ - 1) * x * x / (2.0 * knee_width_);
    }
  }

  // Level detector.
  double yl;
  {
    const double xl(xg - yg);
    switch (detector_type_) {
      case kBranching: {
        if (buffer->prev_yl < xl) {
          yl = WeightedSum(alpha_a_, buffer->prev_yl, xl);
        } else {
          yl = alpha_r_ * buffer->prev_yl;
        }
        break;
      }
      case kDecoupled: {
        const double y1(std::max(xl, alpha_r_ * buffer->prev_y1));
        yl = WeightedSum(alpha_a_, buffer->prev_yl, y1);
        buffer->prev_y1 = y1;
        break;
      }
      case kBranchingSmooth: {
        if (buffer->prev_yl < xl) {
          yl = WeightedSum(alpha_a_, buffer->prev_yl, xl);
        } else {
          yl = WeightedSum(alpha_r_, buffer->prev_yl, xl);
        }
        break;
      }
      case kDecoupledSmooth: {
        const double y1(
            std::max(xl, WeightedSum(alpha_r_, buffer->prev_y1, xl)));
        yl = WeightedSum(alpha_a_, buffer->prev_yl, y1);
        buffer->prev_y1 = y1;
        break;
      }
      default: {
        return false;
      }
    }
    buffer->prev_yl = yl;
  }

  // Compress input.
  const double g(std::pow(10.0, 0.05 * (makeup_gain_ - yl)));
  *output = input * g;

  return true;
}